

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  Arena *pAVar1;
  _func_int **pp_Var2;
  ErrorReporter *pEVar3;
  Resolver *pRVar4;
  PointerReader reader;
  PointerReader reader_00;
  Builder target;
  Field field;
  ImplicitParams implicitMethodParams;
  undefined1 auVar5 [40];
  Reader name;
  Reader name_00;
  undefined8 uVar6;
  BrandScope *pBVar7;
  char cVar8;
  BrandScope *pBVar9;
  ulong uVar10;
  StructSchema schema;
  uint uVar11;
  undefined8 uVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char (*in_R8) [32];
  ElementCount index;
  ulong uVar16;
  ListSchema schema_00;
  Reader RVar17;
  StringPtr message;
  StringPtr message_00;
  undefined4 uVar18;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_527;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined6 uVar21;
  undefined2 uVar22;
  undefined4 uVar23;
  undefined2 uVar24;
  undefined2 uVar25;
  undefined6 uVar26;
  undefined6 uVar27;
  undefined1 uVar28;
  undefined1 in_stack_fffffffffffffb07;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 in_stack_fffffffffffffb0c;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  Reader proto;
  Type constType;
  Schema constSchema;
  Builder bindings;
  undefined7 uStack_458;
  undefined1 uStack_451;
  Reader objValue;
  undefined8 local_400;
  ArrayPtr<const_char> local_3d8;
  char *local_3c8;
  long local_3c0;
  Reader constValue;
  Builder constBrand;
  Reader constReader;
  BrandedDecl constDecl;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  MallocMessageBuilder builder;
  
  constDecl.body.tag = 0;
  constDecl.brand.disposer = (Disposer *)0x0;
  constDecl.brand.ptr = (BrandScope *)0x0;
  constDecl.source._reader.segment = (SegmentReader *)0x0;
  constDecl.source._reader.capTable = (CapTableReader *)0x0;
  constDecl.source._reader.data = (void *)0x0;
  constDecl.source._reader.pointers._0_6_ = 0;
  constDecl.source._reader.pointers._6_2_ = 0;
  constDecl.source._reader.dataSize = 0;
  constDecl.source._reader.pointerCount = 0;
  constDecl.source._reader.nestingLimit = 0x7fffffff;
  uVar23 = 0;
  uVar24 = 0;
  uVar25 = 0;
  uVar26 = 0;
  uVar20 = (void *)0x0;
  uVar21 = 0;
  uVar22 = 0;
  __kjCondition = (Exception *)0x0;
  uVar19 = (Schema)0x0;
  uVar28 = INLINE_COMPOSITE;
  uVar29 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = in_stack_fffffffffffffb0c;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = in_stack_fffffffffffffb07;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  auVar5 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar5._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar5._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar5._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar5._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar5._32_4_;
  implicitMethodParams.params.reader.step = auVar5._36_4_;
  BrandScope::compileDeclExpression
            ((Maybe<capnp::compiler::BrandedDecl> *)&constValue,(this->localBrand).ptr,source,
             this->resolver,implicitMethodParams);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)&builder,
             (NullableValue<capnp::compiler::BrandedDecl> *)&constValue);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)&constValue);
  cVar8 = (char)builder.super_MessageBuilder._vptr_MessageBuilder;
  if ((char)builder.super_MessageBuilder._vptr_MessageBuilder == '\x01') {
    BrandedDecl::operator=(&constDecl,(BrandedDecl *)builder.super_MessageBuilder.arenaSpace);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)&builder);
  if (cVar8 == '\0') goto LAB_0034ac40;
  BrandedDecl::getKind(&constDecl);
  if (((char)builder.super_MessageBuilder._vptr_MessageBuilder != '\x01') ||
     (builder.super_MessageBuilder._vptr_MessageBuilder._2_2_ != 2)) {
    pEVar3 = this->errorReporter;
    name._reader.capTable = (CapTableReader *)uVar20;
    name._reader.segment = (SegmentReader *)uVar19;
    name._reader.data._0_6_ = uVar21;
    name._reader.data._6_2_ = uVar22;
    name._reader.pointers._0_4_ = uVar23;
    name._reader.pointers._4_2_ = uVar24;
    name._reader.pointers._6_2_ = uVar25;
    name._reader.dataSize = (int)uVar26;
    name._reader.pointerCount = (short)((uint6)uVar26 >> 0x20);
    name._reader._38_1_ = uVar28;
    name._reader._39_1_ = in_stack_fffffffffffffb07;
    name._reader.nestingLimit = uVar29;
    name._reader._44_4_ = in_stack_fffffffffffffb0c;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              ((String *)&builder,(kj *)0x4c8c3f,(char (*) [2])&constValue,
               (String *)"\' does not refer to a constant.",in_R8);
    if (builder.super_MessageBuilder.arenaSpace[0] == (void *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (char *)CONCAT44(builder.super_MessageBuilder._vptr_MessageBuilder._4_4_,
                                 CONCAT22(builder.super_MessageBuilder._vptr_MessageBuilder._2_2_,
                                          CONCAT11(builder.super_MessageBuilder._vptr_MessageBuilder
                                                   ._1_1_,(char)builder.super_MessageBuilder.
                                                                _vptr_MessageBuilder)));
    }
    message.content.size_ =
         (long)builder.super_MessageBuilder.arenaSpace[0] +
         (ulong)(builder.super_MessageBuilder.arenaSpace[0] == (void *)0x0);
    message.content.ptr = pcVar13;
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&source,message);
    kj::Array<char>::~Array((Array<char> *)&builder);
    kj::Array<char>::~Array((Array<char> *)&constValue);
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_0034ac40;
  }
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::schema::Brand>(&constBrand,&builder.super_MessageBuilder);
  pBVar7 = constDecl.brand.ptr;
  _kjCondition.value = constDecl.body.tag == 1;
  if (constDecl.body.tag != 1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&constValue,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
               ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal((Fault *)&constValue);
  }
  proto._reader.segment = (SegmentReader *)0x0;
  proto._reader.capTable = (CapTableReader *)0x0;
  proto._reader.data = (void *)0x0;
  proto._reader.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  pBVar9 = constDecl.brand.ptr;
  do {
    constReader._reader.segment = (SegmentReader *)pBVar9;
    if (((pBVar9->params).size_ != 0) ||
       ((pBVar9->inherited == true && (pBVar9->leafParamCount != 0)))) {
      kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                ((Vector<capnp::compiler::BrandScope*> *)&proto,(BrandScope **)&constReader);
    }
    pBVar9 = (BrandScope *)(constReader._reader.segment)->readLimiter;
  } while (pBVar9 != (BrandScope *)0x0);
  if ((long)proto._reader.capTable - (long)proto._reader.segment != 0) {
    uVar23 = constBrand._builder.dataSize;
    uVar24 = constBrand._builder.pointerCount;
    uVar25 = constBrand._builder._38_2_;
    uVar21 = SUB86(constBrand._builder.pointers,0);
    uVar22 = (undefined2)((ulong)constBrand._builder.pointers >> 0x30);
    __kjCondition = (Exception *)constBrand._builder.segment;
    capnp::schema::Brand::Builder::initScopes
              ((Builder *)&constValue,(Builder *)&_kjCondition,
               (uint)((ulong)((long)proto._reader.capTable - (long)proto._reader.segment) >> 3));
    lVar14 = (long)proto._reader.capTable - (long)proto._reader.segment;
    uVar19 = constBrand._builder.capTable;
    uVar20 = constBrand._builder.data;
    for (uVar16 = 0; uVar16 != lVar14 >> 3; uVar16 = uVar16 + 1) {
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&_kjCondition,(ListBuilder *)&constValue,(ElementCount)uVar16);
      pAVar1 = (&(proto._reader.segment)->arena)[uVar16 & 0xffffffff];
      ((SegmentReader *)uVar20)->arena = (Arena *)pAVar1[5]._vptr_Arena;
      if (*(char *)((long)&pAVar1[6]._vptr_Arena + 4) == '\x01') {
        *(undefined2 *)&(((SegmentReader *)uVar20)->id).value = 1;
      }
      else {
        capnp::schema::Brand::Scope::Builder::initBind
                  (&bindings,(Builder *)&_kjCondition,*(uint *)&pAVar1[8]._vptr_Arena);
        uVar10 = (ulong)bindings.builder.elementCount;
        index = 0;
        for (lVar15 = 0; uVar10 * 0xa8 - lVar15 != 0; lVar15 = lVar15 + 0xa8) {
          pp_Var2 = (&(proto._reader.segment)->arena)[uVar16 & 0xffffffff][7]._vptr_Arena;
          pEVar3 = pBVar7->errorReporter;
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&dynamicConst,&bindings.builder,index);
          capnp::schema::Brand::Binding::Builder::initType
                    ((Builder *)&objValue,(Builder *)&dynamicConst);
          target._builder.capTable._0_4_ = (int)objValue.reader.capTable;
          target._builder.segment = (SegmentBuilder *)objValue.reader.segment;
          target._builder.capTable._4_4_ = (int)((ulong)objValue.reader.capTable >> 0x20);
          target._builder.data._0_4_ = (int)objValue.reader.pointer;
          target._builder.data._4_4_ = (int)((ulong)objValue.reader.pointer >> 0x20);
          target._builder.pointers._0_4_ = objValue.reader.nestingLimit;
          target._builder.pointers._4_4_ = objValue.reader._28_4_;
          target._builder.dataSize = (StructDataBitCount)local_400;
          target._builder._36_4_ = SUB84(local_400,4);
          BrandedDecl::compileAsType((BrandedDecl *)((long)pp_Var2 + lVar15),pEVar3,target);
          index = index + 1;
        }
      }
    }
  }
  kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose
            ((ArrayBuilder<capnp::compiler::BrandScope_*> *)&proto);
  constSchema.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  pRVar4 = this->resolver;
  capnp::_::StructBuilder::asReader(&constBrand._builder);
  (*pRVar4->_vptr_Resolver[6])(&constValue,pRVar4,constDecl.body.field_1._0_8_);
  if ((undefined1)constValue.type == VOID) {
    constSchema.raw = (RawBrandedSchema *)constValue.field_1.enumValue.schema.super_Schema.raw;
    Schema::getProto(&proto,&constSchema);
    if (!isBootstrap) {
      (*this->resolver->_vptr_Resolver[7])(&constValue,this->resolver,constDecl.body.field_1._0_8_);
      if ((undefined1)constValue.type != VOID) goto LAB_0034a8dd;
      proto._reader.segment = constValue.field_1.anyPointerValue.reader.segment;
      proto._reader.capTable = constValue.field_1.anyPointerValue.reader.capTable;
      proto._reader.data = constValue.field_1.listValue.reader.segment;
      proto._reader.pointers = (WirePointer *)constValue.field_1.listValue.reader.capTable;
      proto._reader._32_8_ = constValue.field_1.listValue.reader.ptr;
      proto._reader._40_8_ = constValue.field_1._40_8_;
    }
    constReader._reader.dataSize = proto._reader.dataSize;
    constReader._reader.pointerCount = proto._reader.pointerCount;
    constReader._reader._38_2_ = proto._reader._38_2_;
    constReader._reader.nestingLimit = proto._reader.nestingLimit;
    constReader._reader._44_4_ = proto._reader._44_4_;
    constReader._reader.data = proto._reader.data;
    constReader._reader.pointers = proto._reader.pointers;
    constReader._reader.segment = proto._reader.segment;
    constReader._reader.capTable = proto._reader.capTable;
    capnp::schema::Node::Const::Reader::getValue((Reader *)&constValue,&constReader);
    dynamicConst.reader._32_8_ = constValue.field_1.listValue.reader.capTable;
    dynamicConst.reader._40_8_ = constValue.field_1.listValue.reader.ptr;
    dynamicConst.reader.data = constValue.field_1.structValue.reader.segment;
    dynamicConst.reader.pointers = constValue.field_1.anyPointerValue.reader.pointer;
    dynamicConst.reader.capTable =
         (CapTableReader *)constValue.field_1.anyPointerValue.reader.segment;
    dynamicConst.schema.super_Schema.raw = (Schema)((long)schemas::s_ce23dcd2d7b00c9b + 0x48);
    DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&dynamicConst);
    if (_kjCondition.value != true) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x91d,FAILED,"dynamicConst.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    uVar12 = CONCAT26(uVar25,CONCAT24(uVar24,uVar23));
    uVar6 = CONCAT17(in_stack_fffffffffffffb07,CONCAT16(uVar28,uVar26));
    bindings.builder.segment._7_1_ = (undefined1)uVar19;
    bindings.builder.capTable._0_7_ = (undefined7)((ulong)uVar19 >> 8);
    bindings.builder.capTable._7_1_ = (undefined1)uVar20;
    bindings.builder.ptr._0_7_ = (undefined7)((ulong)uVar20 >> 8);
    bindings.builder.ptr._7_1_ = (undefined1)uVar21;
    bindings.builder.elementCount = (ListElementCount)((uint6)uVar21 >> 8);
    bindings.builder.step._0_3_ = (undefined3)(CONCAT26(uVar22,uVar21) >> 0x28);
    bindings.builder.step._3_1_ = (undefined1)uVar23;
    bindings.builder._32_7_ = SUB87((ulong)uVar12 >> 8,0);
    bindings.builder._39_1_ = SUB61(uVar26,0);
    uStack_458 = (undefined7)((ulong)uVar6 >> 8);
    uStack_451 = (undefined1)uVar29;
    field.index = (int)uVar20;
    field.parent.super_Schema.raw = (Schema)(Schema)uVar19;
    field._12_4_ = (int)((ulong)uVar20 >> 0x20);
    field.proto._reader.segment._0_4_ = (int)uVar21;
    field.proto._reader.segment._4_4_ = (int)(CONCAT26(uVar22,uVar21) >> 0x20);
    field.proto._reader.capTable._0_4_ = uVar23;
    field.proto._reader.capTable._4_4_ = (int)((ulong)uVar12 >> 0x20);
    field.proto._reader.data._0_4_ = (int)uVar26;
    field.proto._reader.data._4_4_ = (int)((ulong)uVar6 >> 0x20);
    field.proto._reader.pointers._0_4_ = uVar29;
    field.proto._reader.pointers._4_4_ = in_stack_fffffffffffffb0c;
    field.proto._reader._32_8_ = local_4f0;
    field.proto._reader._40_8_ = uStack_4e8;
    uVar27 = uVar26;
    DynamicStruct::Reader::get(&constValue,&dynamicConst,field);
    uVar30 = uVar29;
    if (constValue.type == ANY_POINTER) {
      DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply(&objValue,&constValue);
      __kjCondition = (Exception *)Schema::asConst(&constSchema);
      constType = ConstSchema::getType((ConstSchema *)&_kjCondition);
      uVar11 = 0xe;
      if (((undefined1  [16])constType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        uVar11 = constType._0_4_;
      }
      uVar30 = (undefined4)((uint6)uVar26 >> 8);
      if ((short)uVar11 == 0xe) {
        schema_00 = Type::asList(&constType);
        reader_00.capTable._0_4_ = (int)objValue.reader.capTable;
        reader_00.segment = objValue.reader.segment;
        reader_00.capTable._4_4_ = (int)((ulong)objValue.reader.capTable >> 0x20);
        reader_00.pointer._0_4_ = (int)objValue.reader.pointer;
        reader_00.pointer._4_4_ = (int)((ulong)objValue.reader.pointer >> 0x20);
        reader_00.nestingLimit = objValue.reader.nestingLimit;
        reader_00._28_4_ = objValue.reader._28_4_;
        capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                  ((Reader *)&bindings,reader_00,schema_00);
        __kjCondition = 8;
        uVar19._7_1_ = bindings.builder.segment._7_1_;
        uVar19._0_7_ = bindings.builder.segment._0_7_;
        uVar20 = CONCAT17(bindings.builder.capTable._7_1_,bindings.builder.capTable._0_7_);
        uVar21 = (undefined6)bindings.builder.ptr._0_7_;
        uVar22 = (undefined2)
                 (CONCAT17(bindings.builder.ptr._7_1_,bindings.builder.ptr._0_7_) >> 0x30);
        uVar24 = (undefined2)bindings.builder.step;
        uVar25 = (undefined2)(bindings.builder.step >> 0x10);
        uVar27 = bindings.builder._32_6_;
        uVar28 = bindings.builder.elementSize;
        in_stack_fffffffffffffb0c = (undefined4)(CONCAT17(uStack_451,uStack_458) >> 0x20);
        uVar23 = bindings.builder.elementCount;
        in_stack_fffffffffffffb07 = bindings.builder._39_1_;
        DynamicValue::Reader::operator=(&constValue,(Reader *)&_kjCondition);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      }
      else if ((uVar11 & 0xffff) == 0x10) {
        schema = Type::asStruct(&constType);
        reader.capTable._0_4_ = (int)objValue.reader.capTable;
        reader.segment = objValue.reader.segment;
        reader.capTable._4_4_ = (int)((ulong)objValue.reader.capTable >> 0x20);
        reader.pointer._0_4_ = (int)objValue.reader.pointer;
        reader.pointer._4_4_ = (int)((ulong)objValue.reader.pointer >> 0x20);
        reader.nestingLimit = objValue.reader.nestingLimit;
        reader._28_4_ = objValue.reader._28_4_;
        capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                  ((Reader *)&bindings,reader,schema);
        __kjCondition = 10;
        uVar19._7_1_ = bindings.builder.segment._7_1_;
        uVar19._0_7_ = bindings.builder.segment._0_7_;
        uVar20 = CONCAT17(bindings.builder.capTable._7_1_,bindings.builder.capTable._0_7_);
        uVar21 = (undefined6)bindings.builder.ptr._0_7_;
        uVar22 = (undefined2)
                 (CONCAT17(bindings.builder.ptr._7_1_,bindings.builder.ptr._0_7_) >> 0x30);
        uVar24 = (undefined2)bindings.builder.step;
        uVar25 = (undefined2)(bindings.builder.step >> 0x10);
        uVar27 = bindings.builder._32_6_;
        uVar28 = bindings.builder.elementSize;
        in_stack_fffffffffffffb0c = (undefined4)(CONCAT17(uStack_451,uStack_458) >> 0x20);
        uVar23 = bindings.builder.elementCount;
        in_stack_fffffffffffffb07 = bindings.builder._39_1_;
        DynamicValue::Reader::operator=(&constValue,(Reader *)&_kjCondition);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      }
      else {
        uVar30 = uVar29;
        if ((uVar11 & 0xffff) != 0x12) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x92f,FAILED,(char *)0x0,
                     "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                     (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
        }
      }
    }
    if ((0xf < source._reader.dataSize) && (*source._reader.data == 5)) {
      if (proto._reader.dataSize < 0xc0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *(undefined8 *)((long)proto._reader.data + 0x10);
      }
      (*this->resolver->_vptr_Resolver[6])(&_kjCondition,this->resolver,uVar12);
      constType.baseType._0_1_ = _kjCondition.value;
      if (_kjCondition.value == true) {
        constType.field_4.scopeId = uVar19;
        Schema::getProto((Reader *)&_kjCondition,(Schema *)&constType.field_4);
        local_3c0 = 1;
        local_3c8 = "";
        if ((0x6f < (uint)uVar23) && (*(short *)((long)&((ClientHook *)uVar20)->brand + 4) != 0)) {
          RVar17 = capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition);
          if ((uint)uVar23 < 0x60) {
            uVar16 = 0;
          }
          else {
            uVar16 = (ulong)(((SegmentReader *)uVar20)->id).value;
          }
          local_3c8 = RVar17.super_StringPtr.content.ptr + uVar16;
          local_3c0 = RVar17.super_StringPtr.content.size_ - uVar16;
        }
        Expression::Reader::getRelativeName((Reader *)&bindings,&source);
        local_3d8 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&bindings);
        pEVar3 = this->errorReporter;
        uVar29 = SUB84(source._reader.data,0);
        uVar18 = (undefined4)((ulong)source._reader.data >> 0x20);
        name_00._reader.capTable = (CapTableReader *)uVar20;
        name_00._reader.segment = (SegmentReader *)uVar19;
        name_00._reader.data._0_6_ = uVar21;
        name_00._reader.data._6_2_ = uVar22;
        name_00._reader.pointers._0_4_ = uVar23;
        name_00._reader.pointers._4_2_ = uVar24;
        name_00._reader.pointers._6_2_ = uVar25;
        name_00._reader.dataSize = (int)uVar27;
        name_00._reader.pointerCount = (short)((uint6)uVar27 >> 0x20);
        name_00._reader._38_1_ = uVar28;
        name_00._reader._39_1_ = in_stack_fffffffffffffb07;
        name_00._reader.nestingLimit = uVar30;
        name_00._reader._44_4_ = in_stack_fffffffffffffb0c;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  ((String *)&bindings,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])&objValue,(String *)"\' with \'",(char (*) [9])&local_3c8,
                   (StringPtr *)0x4e5c7e,(char (*) [2])&local_3d8,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar18,uVar29));
        lVar14 = CONCAT17(bindings.builder.capTable._7_1_,bindings.builder.capTable._0_7_);
        if (lVar14 == 0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = (char *)CONCAT17(bindings.builder.segment._7_1_,bindings.builder.segment._0_7_);
        }
        message_00.content.size_ = lVar14 + (ulong)(lVar14 == 0);
        message_00.content.ptr = pcVar13;
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&source,message_00);
        kj::Array<char>::~Array((Array<char> *)&bindings);
        kj::Array<char>::~Array((Array<char> *)&objValue);
      }
    }
    kj::_::NullableValue<capnp::DynamicValue::Reader>::NullableValue
              (&__return_storage_ptr__->ptr,&constValue);
    DynamicValue::Reader::~Reader(&constValue);
  }
  else {
LAB_0034a8dd:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
LAB_0034ac40:
  BrandedDecl::~BrandedDecl(&constDecl);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  BrandedDecl constDecl = nullptr;
  KJ_IF_SOME(decl, compileDeclExpression(source, ImplicitParams::none())) {
    constDecl = decl;
  } else {
    // Lookup will have reported an error.
    return kj::none;
  }